

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O3

Status uncompress(Header *header,FILE *ifp,FILE *ofp,CompType type)

{
  ushort uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [11];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  byte bVar30;
  uint uVar31;
  Ferror FVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  undefined **ppuVar36;
  Status SVar37;
  char *pcVar38;
  count_int *pcVar39;
  count_int *pcVar40;
  undefined1 auVar41 [16];
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  undefined1 auVar42 [16];
  undefined1 auVar50 [11];
  char cVar55;
  byte bVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  Byte local_55;
  uint local_54;
  undefined1 auVar51 [15];
  char cVar54;
  
  init_garble();
  crc = 0;
  clear_flg = 0;
  offset = 0;
  size = 0;
  readsize = (long)header->complen;
  if (type == UNIX_COMPRESS) {
    read_byte(ifp);
    read_byte(ifp);
    bVar30 = read_byte(ifp);
    maxbits = (int)(bVar30 & 0x1f);
    readsize = readsize + -3;
  }
  else if (type == SQUASH) {
    maxbits = 0xd;
  }
  else if (arcfs == 0) {
    bVar30 = read_byte(ifp);
    maxbits = (int)bVar30;
    readsize = readsize + -1;
  }
  else {
    maxbits = arcfs_maxbits;
    ungarble('\0');
  }
  maxmaxcode = ~(-1 << ((byte)maxbits & 0x1f));
  n_bits = 9;
  maxcode = 0x1ff;
  memset(codetab,0,0x200);
  lVar34 = 0x100;
  auVar41 = _DAT_00106760;
  do {
    cVar49 = auVar41[7];
    auVar18[0xd] = 0;
    auVar18._0_13_ = auVar41._0_13_;
    auVar18[0xe] = cVar49;
    cVar48 = auVar41[6];
    auVar19[0xc] = cVar48;
    auVar19._0_12_ = auVar41._0_12_;
    auVar19._13_2_ = auVar18._13_2_;
    auVar20[0xb] = 0;
    auVar20._0_11_ = auVar41._0_11_;
    auVar20._12_3_ = auVar19._12_3_;
    cVar47 = auVar41[5];
    auVar21[10] = cVar47;
    auVar21._0_10_ = auVar41._0_10_;
    auVar21._11_4_ = auVar20._11_4_;
    auVar22[9] = 0;
    auVar22._0_9_ = auVar41._0_9_;
    auVar22._10_5_ = auVar21._10_5_;
    cVar46 = auVar41[4];
    auVar23[8] = cVar46;
    auVar23._0_8_ = auVar41._0_8_;
    auVar23._9_6_ = auVar22._9_6_;
    auVar42[7] = 0;
    auVar42._0_7_ = auVar23._8_7_;
    auVar26._7_8_ = 0;
    auVar26._0_7_ = auVar23._8_7_;
    cVar45 = auVar41[3];
    auVar28._1_8_ = SUB158(auVar26 << 0x40,7);
    auVar28[0] = cVar45;
    auVar28._9_6_ = 0;
    cVar44 = auVar41[2];
    auVar27._1_10_ = SUB1510(auVar28 << 0x30,5);
    auVar27[0] = cVar44;
    auVar29._11_4_ = 0;
    auVar29._0_11_ = auVar27;
    cVar43 = auVar41[1];
    auVar24[2] = cVar43;
    auVar24._0_2_ = auVar41._0_2_;
    auVar24._3_12_ = SUB1512(auVar29 << 0x20,3);
    auVar25._2_13_ = auVar24._2_13_;
    auVar25._0_2_ = auVar41._0_2_ & 0xff;
    auVar42._8_4_ = auVar25._0_4_;
    auVar42._12_4_ = auVar27._0_4_;
    auVar42 = pshuflw(auVar42,auVar42,0x1b);
    auVar42 = pshufhw(auVar42,auVar42,0x1b);
    auVar52[8] = auVar41[8];
    auVar52[9] = 0;
    cVar54 = auVar41[9];
    auVar52[10] = cVar54;
    bVar30 = auVar41[10];
    cVar55 = auVar41[0xb];
    bVar56 = auVar41[0xc];
    auVar50._0_10_ = (unkuint10)bVar56 << 0x40;
    cVar57 = auVar41[0xd];
    auVar50[10] = cVar57;
    auVar51[0xb] = 0;
    auVar51._0_11_ = auVar50;
    cVar58 = auVar41[0xe];
    auVar51[0xc] = cVar58;
    auVar51[0xd] = 0;
    cVar59 = auVar41[0xf];
    auVar51[0xe] = cVar59;
    auVar52[3] = 0;
    auVar52._0_3_ = auVar50._8_3_;
    auVar52._4_3_ = auVar51._12_3_;
    auVar52[7] = 0;
    auVar52[0xb] = 0;
    auVar52._12_3_ = (int3)(CONCAT16(cVar55,(uint6)bVar30 << 0x20) >> 0x20);
    auVar52[0xf] = 0;
    auVar53 = pshuflw(auVar52,auVar52,0x1b);
    auVar53 = pshufhw(auVar53,auVar53,0x1b);
    sVar2 = auVar53._0_2_;
    sVar3 = auVar53._2_2_;
    sVar4 = auVar53._4_2_;
    sVar5 = auVar53._6_2_;
    sVar6 = auVar53._8_2_;
    sVar7 = auVar53._10_2_;
    sVar8 = auVar53._12_2_;
    sVar9 = auVar53._14_2_;
    sVar10 = auVar42._0_2_;
    sVar11 = auVar42._2_2_;
    sVar12 = auVar42._4_2_;
    sVar13 = auVar42._6_2_;
    sVar14 = auVar42._8_2_;
    sVar15 = auVar42._10_2_;
    sVar16 = auVar42._12_2_;
    sVar17 = auVar42._14_2_;
    *(char *)((long)codetab + lVar34 + 0x1fff0) =
         (0 < sVar2) * (sVar2 < 0x100) * auVar53[0] - (0xff < sVar2);
    *(char *)((long)codetab + lVar34 + 0x1fff1) =
         (0 < sVar3) * (sVar3 < 0x100) * auVar53[2] - (0xff < sVar3);
    *(char *)((long)codetab + lVar34 + 0x1fff2) =
         (0 < sVar4) * (sVar4 < 0x100) * auVar53[4] - (0xff < sVar4);
    *(char *)((long)codetab + lVar34 + 0x1fff3) =
         (0 < sVar5) * (sVar5 < 0x100) * auVar53[6] - (0xff < sVar5);
    *(char *)((long)codetab + lVar34 + 0x1fff4) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar53[8] - (0xff < sVar6);
    *(char *)((long)codetab + lVar34 + 0x1fff5) =
         (0 < sVar7) * (sVar7 < 0x100) * auVar53[10] - (0xff < sVar7);
    *(char *)((long)codetab + lVar34 + 0x1fff6) =
         (0 < sVar8) * (sVar8 < 0x100) * auVar53[0xc] - (0xff < sVar8);
    *(char *)((long)codetab + lVar34 + 0x1fff7) =
         (0 < sVar9) * (sVar9 < 0x100) * auVar53[0xe] - (0xff < sVar9);
    *(char *)((long)codetab + lVar34 + 0x1fff8) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar42[0] - (0xff < sVar10);
    *(char *)((long)codetab + lVar34 + 0x1fff9) =
         (0 < sVar11) * (sVar11 < 0x100) * auVar42[2] - (0xff < sVar11);
    *(char *)((long)codetab + lVar34 + 0x1fffa) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar42[4] - (0xff < sVar12);
    *(char *)((long)codetab + lVar34 + 0x1fffb) =
         (0 < sVar13) * (sVar13 < 0x100) * auVar42[6] - (0xff < sVar13);
    *(char *)((long)codetab + lVar34 + 0x1fffc) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar42[8] - (0xff < sVar14);
    *(char *)((long)codetab + lVar34 + 0x1fffd) =
         (0 < sVar15) * (sVar15 < 0x100) * auVar42[10] - (0xff < sVar15);
    *(char *)((long)codetab + lVar34 + 0x1fffe) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar42[0xc] - (0xff < sVar16);
    *(char *)((long)codetab + lVar34 + 0x1ffff) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar42[0xe] - (0xff < sVar17);
    auVar41[0] = auVar41[0] + -0x10;
    auVar41[1] = cVar43 + -0x10;
    auVar41[2] = cVar44 + -0x10;
    auVar41[3] = cVar45 + -0x10;
    auVar41[4] = cVar46 + -0x10;
    auVar41[5] = cVar47 + -0x10;
    auVar41[6] = cVar48 + -0x10;
    auVar41[7] = cVar49 + -0x10;
    auVar41[8] = auVar52[8] - 0x10;
    auVar41[9] = cVar54 + -0x10;
    auVar41[10] = bVar30 - 0x10;
    auVar41[0xb] = cVar55 + -0x10;
    auVar41[0xc] = bVar56 - 0x10;
    auVar41[0xd] = cVar57 + -0x10;
    auVar41[0xe] = cVar58 + -0x10;
    auVar41[0xf] = cVar59 + -0x10;
    lVar34 = lVar34 + -0x10;
  } while (lVar34 != 0);
  free_ent = 0x101;
  local_54 = getcode(ifp);
  if (local_54 != 0xffffffff) {
    local_55 = (Byte)local_54;
    if (type == CRUNCH) {
      putc_init();
      putc_ncr(ofp,local_55);
    }
    else {
      if (testing == '\0') {
        write_byte(ofp,local_55);
      }
      calccrc(local_55);
    }
    uVar31 = getcode(ifp);
    if (uVar31 != 0xffffffff) {
      pcVar40 = htab + 0x4000;
      do {
        FVar32 = check_stream(ifp);
        if (FVar32 != FNOERR) break;
        uVar33 = uVar31;
        if (uVar31 == 0x100) {
          memset(codetab,0,0x200);
          clear_flg = 1;
          free_ent = 0x100;
          uVar33 = getcode(ifp);
          if (uVar33 == 0xffffffff) break;
        }
        pcVar39 = pcVar40;
        uVar31 = uVar33;
        if (free_ent <= (int)uVar33) {
          *(Byte *)pcVar40 = local_55;
          pcVar39 = (count_int *)((long)pcVar40 + 1);
          uVar31 = local_54;
        }
        uVar35 = (ulong)uVar31;
        pcVar40 = pcVar39;
        if (0xff < (int)uVar31) {
          do {
            pcVar39 = (count_int *)((long)pcVar40 + 1);
            if (&free_ent < pcVar39) goto LAB_0010413c;
            *(Byte *)pcVar40 = *(Byte *)((long)htab + uVar35);
            uVar1 = codetab[uVar35];
            uVar35 = (ulong)uVar1;
            uVar31 = (uint)uVar1;
            pcVar40 = pcVar39;
          } while (0xff < uVar1);
        }
        pcVar40 = (count_int *)((long)pcVar39 + 1);
        if (&free_ent < pcVar40) {
LAB_0010413c:
          error("%s: uncompress: corrupt or garbled archive file",ourname);
          exit(1);
        }
        local_55 = *(Byte *)((long)htab + (long)(int)uVar31);
        *(Byte *)pcVar39 = local_55;
        while (htab + 0x4000 < pcVar40) {
          pcVar40 = (count_int *)((long)pcVar40 + -1);
          if (type == CRUNCH) {
            putc_ncr(ofp,*(Byte *)pcVar40);
          }
          else {
            if (testing == '\0') {
              write_byte(ofp,*(Byte *)pcVar40);
            }
            calccrc(*(Byte *)pcVar40);
          }
        }
        if (free_ent < maxmaxcode) {
          codetab[free_ent] = (unsigned_short)local_54;
          *(Byte *)((long)htab + (long)free_ent) = local_55;
          free_ent = free_ent + 1;
        }
        uVar31 = getcode(ifp);
        local_54 = uVar33;
      } while (uVar31 != 0xffffffff);
    }
  }
  FVar32 = check_stream(ifp);
  SVar37 = RERR;
  if (FVar32 != FRWERR) {
    if ((testing == '\0') && (FVar32 = check_stream(ofp), FVar32 == FRWERR)) {
      return WERR;
    }
    SVar37 = CRCERR;
    if (header->crc == (Halfword)crc) {
      if (type < 4) {
        ppuVar36 = &PTR_anon_var_dwarf_1d7b_00108da8;
        if (testing == '\0') {
          ppuVar36 = &PTR_anon_var_dwarf_1dcb_00108dc8;
        }
        pcVar38 = ppuVar36[type];
      }
      else {
        pcVar38 = "internal error";
      }
      SVar37 = NOERR;
      if (quiet == '\0') {
        SVar37 = NOERR;
        msg("%s",pcVar38);
      }
    }
  }
  return SVar37;
}

Assistant:

Status
uncompress(Header *header, FILE *ifp, FILE *ofp, CompType type)
{
	/* BB changed next line. stackp points to huge pointers. */
	register char_type NSHUGE *stackp;
	register code_int finchar;
	register code_int code, oldcode, incode;
	char *message;

	init_garble();

#if !defined(BB_HUGE_STATIC_ARRAYS)
	if (!htab)
		htab = (count_int NSHUGE *) farcalloc(HSIZE, sizeof(count_int));
	if (!codetab)
		codetab =
			(unsigned short NSHUGE *) farcalloc(HSIZE,
											  sizeof(unsigned short));
	if (!htab || !codetab)
	{
		error("%s: uncompress: out of memory", ourname);
		exit(1);
	}
#endif							/* ! BB_HUGE_STATIC_ARRAYS */

	crc = 0;
	clear_flg = 0;
	offset = 0;
	size = 0;
	readsize = header->complen;

	if (type == SQUASH)
		maxbits = SQUASHBITS;
	else if (type == UNIX_COMPRESS)
	{
		/* Read the unix compress header */
		read_byte(ifp);
		read_byte(ifp);
		maxbits = read_byte(ifp) & 0x1f;
		readsize -= 3;
	}
	else
	{
		if (arcfs)
		{
			maxbits = arcfs_maxbits;
			ungarble('\0'); // Need to consume one byte of password.
		}
		else
		{
			maxbits = read_byte(ifp);
			readsize--;
		}
	}
	maxmaxcode = MAXCODE(maxbits);

	/*
	 * As above, initialize the first 256 entries in the table.
	 */
	maxcode = MAXCODE(n_bits = INIT_BITS);
	for (code = 255; code >= 0; code--)
	{
		tab_prefixof(code) = 0;
		tab_suffixof(code) = (char_type) code;
	}
	free_ent = FIRST;

	finchar = oldcode = getcode(ifp);
	if (oldcode == -1)			/* EOF already? */
		goto compress_exit;		/* Get out of here */

	/* first code must be 8 bits = char */
	if (type == CRUNCH)
	{
		putc_init();
		/* BB changed next line for Borland C/C++ 4 */
		putc_ncr(ofp, (Byte) finchar);
	}
	else
	{
		/* BB changed next three lines for Borland C/C++ 4 */
		if (!testing)
			write_byte(ofp, (Byte) finchar);
		calccrc((Byte) finchar);
	}

	stackp = de_stack;

	while ((code = getcode(ifp)) != -1)
	{
		if (check_stream(ifp) != FNOERR)
			break;
		if (code == CLEAR)
		{
			for (code = 255; code >= 0; code--)
				tab_prefixof(code) = 0;
			clear_flg = 1;
			free_ent = FIRST - 1;
			if ((code = getcode(ifp)) == -1)	/* O, untimely death! */
				break;
		}
		incode = code;
		/*
		 * Special case for KwKwK string.
		 */
		if (code >= free_ent)
		{
			/* BB changed next line for Borland C/C++ 4 */
			*stackp++ = (char_type) finchar;
			code = oldcode;
		}
		/*
		 * Generate output characters in reverse order
		 */

		while (code >= 256)
		{
			if ((char NSHUGE *)(stackp+1) > (char NSHUGE *)(&htab[0] + HSIZE))
			{
				error("%s: uncompress: corrupt or garbled archive file", ourname);
				exit(1);
			}
			*stackp++ = tab_suffixof(code);
			code = tab_prefixof(code);
		}
		if ((char NSHUGE *)(stackp+1) > (char NSHUGE *)(&htab[0] + HSIZE))
		{
			error("%s: uncompress: corrupt or garbled archive file", ourname);
			exit(1);
		}
		/* BB changed next line for Borland C/C++ 4 */
		/* *stackp++ = finchar = tab_suffixof(code); */
		finchar = tab_suffixof(code);
		*stackp++ = (char_type) finchar;

		/*
		 * And put them out in forward order
		 */
		while (stackp > de_stack)
		{
			stackp--;
			if (type == CRUNCH)
				putc_ncr(ofp, *stackp);
			else
			{
				if (!testing)
					write_byte(ofp, *stackp);
				calccrc(*stackp);
			}
		}

		/*
		 * Generate the new entry.
		 */
		if ((code = free_ent) < maxmaxcode)
		{
			/* BB changed next two lines for Borland C/C++ 4 */
			tab_prefixof(code) = (unsigned short) oldcode;
			tab_suffixof(code) = (char_type) finchar;
			free_ent = code + 1;
		}
		/*
		 * Remember previous code.
		 */
		oldcode = incode;
	}
  compress_exit:
	if (check_stream(ifp) == FRWERR)
		return (RERR);
	if (!testing && check_stream(ofp) == FRWERR)
		return (WERR);
	if ((Halfword) crc != header->crc)
		return (CRCERR);
	if (testing)
		switch (type)
		{
		case COMPRESS:
		case UNIX_COMPRESS:
			message = "OK (compressed)";
			break;
		case CRUNCH:
			message = "OK (crunched)";
			break;
		case SQUASH:
			message = "OK (squashed)";
			break;
		default:
			message = "internal error";
			break;
		}
	else
		switch (type)
		{
		case COMPRESS:
		case UNIX_COMPRESS:
			message = "uncompressed";
			break;
		case CRUNCH:
			message = "uncrunched";
			break;
		case SQUASH:
			message = "unsquashed";
			break;
		default:
			message = "internal error";
			break;
		}
	if (!quiet)
		msg("%s", message);
	return (NOERR);
}